

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

tests * lest::make_tests<lest::test[2]>(tests *__return_storage_ptr__,test (*c) [2])

{
  test *in_RCX;
  
  make<std::vector<lest::test,std::allocator<lest::test>>,lest::test>
            (__return_storage_ptr__,(lest *)c,c[1],in_RCX);
  return __return_storage_ptr__;
}

Assistant:

tests make_tests( C const & c ) { return make_tests( test_begin( c ), test_end( c ) ); }